

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_init_zstream(archive_write *a)

{
  long lVar1;
  archive *in_RDI;
  int r;
  iso9660_conflict *iso9660;
  undefined4 local_1c;
  int local_4;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  *(undefined8 *)(lVar1 + 0x248) = 0;
  *(undefined4 *)(lVar1 + 0x250) = 0;
  *(undefined8 *)(lVar1 + 600) = 0;
  *(undefined8 *)(lVar1 + 0x270) = 0;
  if (*(int *)(lVar1 + 0x2b8) == 0) {
    local_1c = deflateInit_(lVar1 + 0x248,*(undefined4 *)(lVar1 + 0x2c8),"1.2.11",0x70);
    *(undefined4 *)(lVar1 + 0x2b8) = 1;
  }
  else {
    local_1c = deflateReset(lVar1 + 0x248);
  }
  switch(local_1c) {
  case 0:
    local_4 = 0;
    break;
  case 0xfffffffa:
    archive_set_error(in_RDI,-1,
                      "Internal error initializing compression library: invalid library version");
    local_4 = -0x1e;
    break;
  default:
  case 0xfffffffe:
    archive_set_error(in_RDI,-1,
                      "Internal error initializing compression library: invalid setup parameter");
    local_4 = -0x1e;
    break;
  case 0xfffffffc:
    archive_set_error(in_RDI,0xc,"Internal error initializing compression library");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
zisofs_init_zstream(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	int r;

	iso9660->zisofs.stream.next_in = NULL;
	iso9660->zisofs.stream.avail_in = 0;
	iso9660->zisofs.stream.total_in = 0;
	iso9660->zisofs.stream.total_out = 0;
	if (iso9660->zisofs.stream_valid)
		r = deflateReset(&(iso9660->zisofs.stream));
	else {
		r = deflateInit(&(iso9660->zisofs.stream),
		    iso9660->zisofs.compression_level);
		iso9660->zisofs.stream_valid = 1;
	}
	switch (r) {
	case Z_OK:
		break;
	default:
	case Z_STREAM_ERROR:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid setup parameter");
		return (ARCHIVE_FATAL);
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Internal error initializing "
		    "compression library");
		return (ARCHIVE_FATAL);
	case Z_VERSION_ERROR:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid library version");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}